

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O2

void Aig_ManCheckPhase(Aig_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  int i;
  uint uVar5;
  
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return;
    }
    pvVar3 = Vec_PtrEntry(p->vObjs,i);
    if (pvVar3 != (void *)0x0) {
      uVar4 = (uint)*(ulong *)((long)pvVar3 + 0x18);
      if ((uVar4 & 7) == 2) {
        if ((*(ulong *)((long)pvVar3 + 0x18) & 8) != 0) {
          __assert_fail("(int)pObj->fPhase == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                        ,0x9d,"void Aig_ManCheckPhase(Aig_Man_t *)");
        }
      }
      else {
        uVar1 = *(ulong *)((long)pvVar3 + 8);
        uVar2 = 1;
        uVar5 = uVar2;
        if (uVar1 != 0) {
          uVar5 = ((uint)uVar1 ^ *(uint *)((uVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
        }
        uVar1 = *(ulong *)((long)pvVar3 + 0x10);
        if (uVar1 != 0) {
          uVar2 = (uint)uVar1 ^ *(uint *)((uVar1 & 0xfffffffffffffffe) + 0x18) >> 3;
        }
        if ((uVar4 >> 3 & 1) != (uVar2 & uVar5)) {
          __assert_fail("(int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCheck.c"
                        ,0x9f,"void Aig_ManCheckPhase(Aig_Man_t *)");
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Aig_ManCheckPhase( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            assert( (int)pObj->fPhase == 0 );
        else
            assert( (int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj))) );
}